

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O2

LArYieldResult * __thiscall
NEST::LArNEST::GetNRYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double density)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double ElectronYields;
  
  dVar1 = (this->fNR).alpha;
  dVar2 = pow(energy,(this->fNR).beta);
  dVar3 = GetNRElectronYields(this,energy,efield);
  ElectronYields = 0.0;
  if (0.0 <= dVar3) {
    ElectronYields = dVar3;
  }
  dVar4 = GetNRPhotonYields(this,energy,efield);
  dVar3 = 0.0;
  if (0.0 <= dVar4) {
    dVar3 = dVar4;
  }
  GetRecombinationYields
            (__return_storage_ptr__,this,dVar2 * dVar1,ElectronYields,dVar3,energy,efield);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetNRYields(double energy, double efield,
                                    double density) {
  double NRTotalYields = GetNRTotalYields(energy);
  double NRElectronYields = GetNRElectronYields(energy, efield);
  if (NRElectronYields < 0.0) {
    NRElectronYields = 0.0;
  }
  double NRPhotonYields = GetNRPhotonYields(energy, efield);
  if (NRPhotonYields < 0.0) {
    NRPhotonYields = 0.0;
  }
  return GetRecombinationYields(NRTotalYields, NRElectronYields, NRPhotonYields,
                                energy, efield);
}